

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_beta_encode_int(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)in_size;
  if (in_size < 1) {
    uVar2 = uVar4;
  }
  uVar3 = 0;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = store_bits_MSB(c->out,(c->field_6).huffman.ncodes + *(int *)(in + uVar4 * 4),
                           (c->field_6).beta.nbits);
    uVar3 = uVar3 | uVar1;
  }
  return uVar3;
}

Assistant:

int cram_beta_encode_int(cram_slice *slice, cram_codec *c,
			 char *in, int in_size) {
    int *syms = (int *)in;
    int i, r = 0;

    for (i = 0; i < in_size; i++)
	r |= store_bits_MSB(c->out, syms[i] + c->e_beta.offset,
			    c->e_beta.nbits);

    return r;
}